

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lsd.cpp
# Opt level: O0

void __thiscall
libtorrent::aux::lsd::lsd
          (lsd *this,io_context *ios,lsd_callback *cb,address *listen_address,address *netmask)

{
  long lVar1;
  address *netmask_local;
  address *listen_address_local;
  lsd_callback *cb_local;
  io_context *ios_local;
  lsd *this_local;
  
  ::std::enable_shared_from_this<libtorrent::aux::lsd>::enable_shared_from_this
            (&this->super_enable_shared_from_this<libtorrent::aux::lsd>);
  this->m_callback = cb;
  boost::asio::ip::address::address(&this->m_listen_address,listen_address);
  boost::asio::ip::address::address(&this->m_netmask,netmask);
  noexcept_move_only<boost::asio::basic_datagram_socket<boost::asio::ip::udp,boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context&>,boost::asio::execution::detail::blocking::never_t<0>,boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>>>>>
  ::noexcept_move_only<boost::asio::io_context>
            ((noexcept_move_only<boost::asio::basic_datagram_socket<boost::asio::ip::udp,boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context&>,boost::asio::execution::detail::blocking::never_t<0>,boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>>>>>
              *)&this->m_socket,ios,(type *)0x0);
  boost::asio::ip::basic_endpoint<boost::asio::ip::udp>::basic_endpoint(&this->m_remote);
  boost::asio::
  basic_waitable_timer<std::chrono::_V2::system_clock,_boost::asio::wait_traits<std::chrono::_V2::system_clock>,_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>_>
  ::basic_waitable_timer<boost::asio::io_context>(&this->m_broadcast_timer,ios,(type *)0x0);
  lVar1 = random((aux *)0x7fffffff);
  this->m_cookie = ((uint)lVar1 ^ (uint)this) & 0x7fffffff;
  this->m_disabled = false;
  return;
}

Assistant:

lsd::lsd(io_context& ios, aux::lsd_callback& cb
	, address const listen_address, address const netmask)
	: m_callback(cb)
	, m_listen_address(listen_address)
	, m_netmask(netmask)
	, m_socket(ios)
	, m_broadcast_timer(ios)
	, m_cookie((aux::random(0x7fffffff) ^ std::uintptr_t(this)) & 0x7fffffff)
{
}